

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

int atomsClose(atom *a,atom *b,float probeRad)

{
  float fVar1;
  int iVar2;
  double dVar3;
  float fVar4;
  
  fVar4 = a->radius;
  fVar1 = b->radius;
  dVar3 = v3distanceSq(&a->loc,&b->loc);
  iVar2 = 0;
  if ((1e-05 < (float)dVar3) &&
     (fVar4 = fVar4 + fVar1 + probeRad + probeRad, iVar2 = 0, (float)dVar3 <= fVar4 * fVar4)) {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int atomsClose(atom *a, atom *b, float probeRad)
{
   int nearpt = FALSE;
   float lim = 0.0, dsq = 0.0;

   lim = a->radius + b->radius + probeRad + probeRad;

   dsq = (float)v3distanceSq(&(a->loc), &(b->loc));

   /* if too close they must be the same atom...dummy atom?? */

/*removing the (dsq > 0.001) test actually removes one side of a clash!!*/
/*20111207 dcr changed test to .003*.003 = .00001 i.e. .001 in each coord */
/* to minimize false same-atom-ness but still allow filtering of dummy atoms*/
   if ((dsq > 0.00001) && (dsq <= (lim*lim)))
   {
      nearpt = TRUE;
   }
   return nearpt;
}